

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O1

void test_qpixl_frqi_util_gray_permutation<float>(void)

{
  float *pfVar1;
  float *pfVar2;
  ulong uVar3;
  value_type *__val_1;
  pointer *__ptr;
  value_type *__val_4;
  char *pcVar4;
  value_type *__val;
  value_type *__val_3;
  initializer_list<float> __l;
  initializer_list<float> __l_00;
  initializer_list<float> __l_01;
  initializer_list<float> __l_02;
  initializer_list<float> __l_03;
  AssertionResult gtest_ar;
  vector<float,_std::allocator<float>_> e;
  vector<float,_std::allocator<float>_> d;
  vector<float,_std::allocator<float>_> c;
  vector<float,_std::allocator<float>_> b;
  vector<float,_std::allocator<float>_> a;
  AssertHelper local_178;
  AssertHelper local_170;
  float local_168 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  vector<float,_std::allocator<float>_> local_128;
  vector<float,_std::allocator<float>_> local_110;
  float *local_f8;
  float *local_f0;
  vector<float,_std::allocator<float>_> local_e8;
  float *local_d0;
  vector<float,_std::allocator<float>_> local_c8;
  float *local_b0;
  float *local_a8;
  float *local_a0;
  vector<float,_std::allocator<float>_> local_98;
  float *local_80;
  float *local_78;
  float *local_70;
  float *local_68;
  float *local_60;
  float *local_58;
  float *local_50;
  float *local_48;
  float *local_40;
  float *local_38;
  
  local_168[0] = 1.0;
  __l._M_len = 1;
  __l._M_array = local_168;
  std::vector<float,_std::allocator<float>_>::vector(&local_98,__l,(allocator_type *)&local_c8);
  pfVar1 = (float *)operator_new(4);
  *pfVar1 = 0.0;
  if ((long)local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start == 4) {
    if (local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish !=
        local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start) {
      uVar3 = 0;
      do {
        pfVar1[uVar3] =
             local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start[uVar3 >> 1 ^ uVar3];
        uVar3 = uVar3 + 1;
      } while (uVar3 != 1);
    }
    testing::internal::CmpHelperEQ<float,float>
              ((internal *)local_168,"a[0]","a_out[0]",
               local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start,pfVar1);
    if (local_168[0]._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_c8);
      if (pbStack_160 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = (pbStack_160->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                 ,0x6a,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&local_c8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
      if (local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start != (float *)0x0) {
        (**(code **)(*(long *)local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start + 8))();
      }
    }
    if (pbStack_160 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_160,pbStack_160);
    }
    qpixl::frqi::grayPermutation<std::vector<float,std::allocator<float>>>(&local_98);
    testing::internal::CmpHelperEQ<float,float>
              ((internal *)local_168,"a[0]","a_out[0]",
               local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start,pfVar1);
    if (local_168[0]._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_c8);
      if (pbStack_160 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = (pbStack_160->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                 ,0x6d,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&local_c8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
      if (local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start != (float *)0x0) {
        (**(code **)(*(long *)local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start + 8))();
      }
    }
    if (pbStack_160 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_160,pbStack_160);
    }
    local_168[0] = 1.0;
    local_168[1] = 2.0;
    __l_00._M_len = 2;
    __l_00._M_array = local_168;
    std::vector<float,_std::allocator<float>_>::vector(&local_c8,__l_00,(allocator_type *)&local_e8)
    ;
    pfVar2 = (float *)operator_new(8);
    pfVar2[0] = 0.0;
    pfVar2[1] = 0.0;
    if ((long)local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start == 8) {
      if (local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_finish !=
          local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start) {
        uVar3 = 0;
        do {
          pfVar2[uVar3] =
               local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start[uVar3 >> 1 ^ uVar3];
          uVar3 = uVar3 + 1;
        } while (uVar3 != 2);
      }
      testing::internal::CmpHelperEQ<float,float>
                ((internal *)local_168,"b[0]","b_out[0]",
                 local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start,pfVar2);
      local_f8 = pfVar2;
      if (local_168[0]._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_e8);
        if (pbStack_160 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          pcVar4 = "";
        }
        else {
          pcVar4 = (pbStack_160->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_110,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                   ,0x76,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_110,(Message *)&local_e8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_110);
        if (local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (float *)0x0) {
          (**(code **)(*(long *)local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start + 8))();
        }
      }
      if (pbStack_160 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&pbStack_160,pbStack_160);
      }
      testing::internal::CmpHelperEQ<float,float>
                ((internal *)local_168,"b[1]","b_out[1]",
                 local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start + 1,pfVar2 + 1);
      if (local_168[0]._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_e8);
        if (pbStack_160 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          pcVar4 = "";
        }
        else {
          pcVar4 = (pbStack_160->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_110,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                   ,0x77,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_110,(Message *)&local_e8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_110);
        if (local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (float *)0x0) {
          (**(code **)(*(long *)local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start + 8))();
        }
      }
      if (pbStack_160 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&pbStack_160,pbStack_160);
      }
      qpixl::frqi::grayPermutation<std::vector<float,std::allocator<float>>>(&local_c8);
      testing::internal::CmpHelperEQ<float,float>
                ((internal *)local_168,"b[0]","b_out[0]",
                 local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start,pfVar2);
      if (local_168[0]._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_e8);
        if (pbStack_160 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          pcVar4 = "";
        }
        else {
          pcVar4 = (pbStack_160->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_110,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                   ,0x7a,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_110,(Message *)&local_e8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_110);
        if (local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (float *)0x0) {
          (**(code **)(*(long *)local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start + 8))();
        }
      }
      if (pbStack_160 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&pbStack_160,pbStack_160);
      }
      testing::internal::CmpHelperEQ<float,float>
                ((internal *)local_168,"b[1]","b_out[1]",
                 local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start + 1,pfVar2 + 1);
      if (local_168[0]._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_e8);
        if (pbStack_160 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          pcVar4 = "";
        }
        else {
          pcVar4 = (pbStack_160->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_110,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                   ,0x7b,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_110,(Message *)&local_e8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_110);
        if (local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (float *)0x0) {
          (**(code **)(*(long *)local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start + 8))();
        }
      }
      if (pbStack_160 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&pbStack_160,pbStack_160);
      }
      local_168[0] = 1.0;
      local_168[1] = 2.0;
      pbStack_160 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    0x4080000040400000;
      __l_01._M_len = 4;
      __l_01._M_array = local_168;
      std::vector<float,_std::allocator<float>_>::vector
                (&local_e8,__l_01,(allocator_type *)&local_110);
      pfVar2 = (float *)operator_new(0x10);
      pfVar2[0] = 0.0;
      pfVar2[1] = 0.0;
      pfVar2[2] = 0.0;
      pfVar2[3] = 0.0;
      if ((long)local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start == 0x10) {
        if (local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start) {
          uVar3 = 0;
          do {
            pfVar2[uVar3] =
                 local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar3 >> 1 ^ uVar3];
            uVar3 = uVar3 + 1;
          } while (uVar3 != 4);
        }
        local_f0 = pfVar2;
        testing::internal::CmpHelperEQ<float,float>
                  ((internal *)local_168,"c[0]","c_out[0]",
                   local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start,pfVar2);
        if (local_168[0]._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&local_110);
          if (pbStack_160 ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar4 = "";
          }
          else {
            pcVar4 = (pbStack_160->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_128,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                     ,0x84,pcVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_128,(Message *)&local_110);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_128);
          if (local_110.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start != (float *)0x0) {
            (**(code **)(*(long *)local_110.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_start + 8))();
          }
        }
        if (pbStack_160 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&pbStack_160,pbStack_160);
        }
        testing::internal::CmpHelperEQ<float,float>
                  ((internal *)local_168,"c[1]","c_out[1]",
                   local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start + 1,pfVar2 + 1);
        if (local_168[0]._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&local_110);
          if (pbStack_160 ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar4 = "";
          }
          else {
            pcVar4 = (pbStack_160->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_128,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                     ,0x85,pcVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_128,(Message *)&local_110);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_128);
          if (local_110.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start != (float *)0x0) {
            (**(code **)(*(long *)local_110.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_start + 8))();
          }
        }
        if (pbStack_160 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&pbStack_160,pbStack_160);
        }
        testing::internal::CmpHelperEQ<float,float>
                  ((internal *)local_168,"c[2]","c_out[3]",
                   local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start + 2,pfVar2 + 3);
        if (local_168[0]._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&local_110);
          if (pbStack_160 ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar4 = "";
          }
          else {
            pcVar4 = (pbStack_160->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_128,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                     ,0x86,pcVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_128,(Message *)&local_110);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_128);
          if (local_110.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start != (float *)0x0) {
            (**(code **)(*(long *)local_110.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_start + 8))();
          }
        }
        if (pbStack_160 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&pbStack_160,pbStack_160);
        }
        testing::internal::CmpHelperEQ<float,float>
                  ((internal *)local_168,"c[3]","c_out[2]",
                   local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start + 3,pfVar2 + 2);
        if (local_168[0]._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&local_110);
          if (pbStack_160 ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar4 = "";
          }
          else {
            pcVar4 = (pbStack_160->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_128,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                     ,0x87,pcVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_128,(Message *)&local_110);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_128);
          if (local_110.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start != (float *)0x0) {
            (**(code **)(*(long *)local_110.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_start + 8))();
          }
        }
        local_d0 = pfVar1;
        if (pbStack_160 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&pbStack_160,pbStack_160);
        }
        qpixl::frqi::grayPermutation<std::vector<float,std::allocator<float>>>(&local_e8);
        testing::internal::CmpHelperEQ<float,float>
                  ((internal *)local_168,"c[0]","c_out[0]",
                   local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start,local_f0);
        if (local_168[0]._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&local_110);
          if (pbStack_160 ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar4 = "";
          }
          else {
            pcVar4 = (pbStack_160->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_128,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                     ,0x8a,pcVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_128,(Message *)&local_110);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_128);
          if (local_110.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start != (float *)0x0) {
            (**(code **)(*(long *)local_110.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_start + 8))();
          }
        }
        if (pbStack_160 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&pbStack_160,pbStack_160);
        }
        testing::internal::CmpHelperEQ<float,float>
                  ((internal *)local_168,"c[1]","c_out[1]",
                   local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start + 1,pfVar2 + 1);
        if (local_168[0]._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&local_110);
          if (pbStack_160 ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar4 = "";
          }
          else {
            pcVar4 = (pbStack_160->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_128,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                     ,0x8b,pcVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_128,(Message *)&local_110);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_128);
          if (local_110.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start != (float *)0x0) {
            (**(code **)(*(long *)local_110.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_start + 8))();
          }
        }
        if (pbStack_160 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&pbStack_160,pbStack_160);
        }
        testing::internal::CmpHelperEQ<float,float>
                  ((internal *)local_168,"c[2]","c_out[2]",
                   local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start + 2,pfVar2 + 2);
        if (local_168[0]._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&local_110);
          if (pbStack_160 ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar4 = "";
          }
          else {
            pcVar4 = (pbStack_160->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_128,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                     ,0x8c,pcVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_128,(Message *)&local_110);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_128);
          if (local_110.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start != (float *)0x0) {
            (**(code **)(*(long *)local_110.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_start + 8))();
          }
        }
        if (pbStack_160 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&pbStack_160,pbStack_160);
        }
        testing::internal::CmpHelperEQ<float,float>
                  ((internal *)local_168,"c[3]","c_out[3]",
                   local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start + 3,pfVar2 + 3);
        if (local_168[0]._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&local_110);
          if (pbStack_160 ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar4 = "";
          }
          else {
            pcVar4 = (pbStack_160->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_128,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                     ,0x8d,pcVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_128,(Message *)&local_110);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_128);
          if (local_110.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start != (float *)0x0) {
            (**(code **)(*(long *)local_110.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_start + 8))();
          }
        }
        if (pbStack_160 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&pbStack_160,pbStack_160);
        }
        local_158 = 0x40c0000040a00000;
        uStack_150 = 0x4100000040e00000;
        local_168[0] = 1.0;
        local_168[1] = 2.0;
        pbStack_160 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      0x4080000040400000;
        __l_02._M_len = 8;
        __l_02._M_array = local_168;
        std::vector<float,_std::allocator<float>_>::vector
                  (&local_110,__l_02,(allocator_type *)&local_128);
        pfVar1 = (float *)operator_new(0x20);
        pfVar1[4] = 0.0;
        pfVar1[5] = 0.0;
        pfVar1[6] = 0.0;
        pfVar1[7] = 0.0;
        pfVar1[0] = 0.0;
        pfVar1[1] = 0.0;
        pfVar1[2] = 0.0;
        pfVar1[3] = 0.0;
        if ((long)local_110.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_110.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start == 0x20) {
          if (local_110.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              local_110.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start) {
            uVar3 = 0;
            do {
              pfVar1[uVar3] =
                   local_110.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar3 >> 1 ^ uVar3];
              uVar3 = uVar3 + 1;
            } while (uVar3 != 8);
          }
          local_a0 = pfVar1;
          testing::internal::CmpHelperEQ<float,float>
                    ((internal *)local_168,"d[0]","d_out[0]",
                     local_110.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start,pfVar1);
          if (local_168[0]._0_1_ == (internal)0x0) {
            testing::Message::Message((Message *)&local_128);
            if (pbStack_160 ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar4 = "";
            }
            else {
              pcVar4 = (pbStack_160->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_178,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                       ,0x96,pcVar4);
            testing::internal::AssertHelper::operator=(&local_178,(Message *)&local_128);
            testing::internal::AssertHelper::~AssertHelper(&local_178);
            if (local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start != (float *)0x0) {
              (**(code **)(*(long *)local_128.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start + 8))();
            }
          }
          if (pbStack_160 !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&pbStack_160,pbStack_160);
          }
          testing::internal::CmpHelperEQ<float,float>
                    ((internal *)local_168,"d[1]","d_out[1]",
                     local_110.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start + 1,pfVar1 + 1);
          if (local_168[0]._0_1_ == (internal)0x0) {
            testing::Message::Message((Message *)&local_128);
            if (pbStack_160 ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar4 = "";
            }
            else {
              pcVar4 = (pbStack_160->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_178,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                       ,0x97,pcVar4);
            testing::internal::AssertHelper::operator=(&local_178,(Message *)&local_128);
            testing::internal::AssertHelper::~AssertHelper(&local_178);
            if (local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start != (float *)0x0) {
              (**(code **)(*(long *)local_128.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start + 8))();
            }
          }
          if (pbStack_160 !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&pbStack_160,pbStack_160);
          }
          testing::internal::CmpHelperEQ<float,float>
                    ((internal *)local_168,"d[2]","d_out[3]",
                     local_110.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start + 2,pfVar1 + 3);
          if (local_168[0]._0_1_ == (internal)0x0) {
            testing::Message::Message((Message *)&local_128);
            if (pbStack_160 ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar4 = "";
            }
            else {
              pcVar4 = (pbStack_160->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_178,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                       ,0x98,pcVar4);
            testing::internal::AssertHelper::operator=(&local_178,(Message *)&local_128);
            testing::internal::AssertHelper::~AssertHelper(&local_178);
            if (local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start != (float *)0x0) {
              (**(code **)(*(long *)local_128.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start + 8))();
            }
          }
          if (pbStack_160 !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&pbStack_160,pbStack_160);
          }
          testing::internal::CmpHelperEQ<float,float>
                    ((internal *)local_168,"d[3]","d_out[2]",
                     local_110.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start + 3,pfVar1 + 2);
          if (local_168[0]._0_1_ == (internal)0x0) {
            testing::Message::Message((Message *)&local_128);
            if (pbStack_160 ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar4 = "";
            }
            else {
              pcVar4 = (pbStack_160->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_178,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                       ,0x99,pcVar4);
            testing::internal::AssertHelper::operator=(&local_178,(Message *)&local_128);
            testing::internal::AssertHelper::~AssertHelper(&local_178);
            if (local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start != (float *)0x0) {
              (**(code **)(*(long *)local_128.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start + 8))();
            }
          }
          if (pbStack_160 !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&pbStack_160,pbStack_160);
          }
          local_a8 = pfVar1 + 7;
          testing::internal::CmpHelperEQ<float,float>
                    ((internal *)local_168,"d[4]","d_out[7]",
                     local_110.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start + 4,local_a8);
          if (local_168[0]._0_1_ == (internal)0x0) {
            testing::Message::Message((Message *)&local_128);
            if (pbStack_160 ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar4 = "";
            }
            else {
              pcVar4 = (pbStack_160->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_178,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                       ,0x9a,pcVar4);
            testing::internal::AssertHelper::operator=(&local_178,(Message *)&local_128);
            testing::internal::AssertHelper::~AssertHelper(&local_178);
            if (local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start != (float *)0x0) {
              (**(code **)(*(long *)local_128.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start + 8))();
            }
          }
          if (pbStack_160 !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&pbStack_160,pbStack_160);
          }
          local_b0 = pfVar1 + 6;
          testing::internal::CmpHelperEQ<float,float>
                    ((internal *)local_168,"d[5]","d_out[6]",
                     local_110.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start + 5,local_b0);
          if (local_168[0]._0_1_ == (internal)0x0) {
            testing::Message::Message((Message *)&local_128);
            if (pbStack_160 ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar4 = "";
            }
            else {
              pcVar4 = (pbStack_160->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_178,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                       ,0x9b,pcVar4);
            testing::internal::AssertHelper::operator=(&local_178,(Message *)&local_128);
            testing::internal::AssertHelper::~AssertHelper(&local_178);
            if (local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start != (float *)0x0) {
              (**(code **)(*(long *)local_128.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start + 8))();
            }
          }
          if (pbStack_160 !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&pbStack_160,pbStack_160);
          }
          testing::internal::CmpHelperEQ<float,float>
                    ((internal *)local_168,"d[6]","d_out[4]",
                     local_110.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start + 6,pfVar1 + 4);
          if (local_168[0]._0_1_ == (internal)0x0) {
            testing::Message::Message((Message *)&local_128);
            if (pbStack_160 ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar4 = "";
            }
            else {
              pcVar4 = (pbStack_160->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_178,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                       ,0x9c,pcVar4);
            testing::internal::AssertHelper::operator=(&local_178,(Message *)&local_128);
            testing::internal::AssertHelper::~AssertHelper(&local_178);
            if (local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start != (float *)0x0) {
              (**(code **)(*(long *)local_128.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start + 8))();
            }
          }
          if (pbStack_160 !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&pbStack_160,pbStack_160);
          }
          testing::internal::CmpHelperEQ<float,float>
                    ((internal *)local_168,"d[7]","d_out[5]",
                     local_110.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start + 7,pfVar1 + 5);
          if (local_168[0]._0_1_ == (internal)0x0) {
            testing::Message::Message((Message *)&local_128);
            if (pbStack_160 ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar4 = "";
            }
            else {
              pcVar4 = (pbStack_160->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_178,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                       ,0x9d,pcVar4);
            testing::internal::AssertHelper::operator=(&local_178,(Message *)&local_128);
            testing::internal::AssertHelper::~AssertHelper(&local_178);
            if (local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start != (float *)0x0) {
              (**(code **)(*(long *)local_128.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start + 8))();
            }
          }
          if (pbStack_160 !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&pbStack_160,pbStack_160);
          }
          qpixl::frqi::grayPermutation<std::vector<float,std::allocator<float>>>(&local_110);
          testing::internal::CmpHelperEQ<float,float>
                    ((internal *)local_168,"d[0]","d_out[0]",
                     local_110.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start,local_a0);
          if (local_168[0]._0_1_ == (internal)0x0) {
            testing::Message::Message((Message *)&local_128);
            if (pbStack_160 ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar4 = "";
            }
            else {
              pcVar4 = (pbStack_160->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_178,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                       ,0xa0,pcVar4);
            testing::internal::AssertHelper::operator=(&local_178,(Message *)&local_128);
            testing::internal::AssertHelper::~AssertHelper(&local_178);
            if (local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start != (float *)0x0) {
              (**(code **)(*(long *)local_128.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start + 8))();
            }
          }
          if (pbStack_160 !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&pbStack_160,pbStack_160);
          }
          testing::internal::CmpHelperEQ<float,float>
                    ((internal *)local_168,"d[1]","d_out[1]",
                     local_110.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start + 1,pfVar1 + 1);
          if (local_168[0]._0_1_ == (internal)0x0) {
            testing::Message::Message((Message *)&local_128);
            if (pbStack_160 ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar4 = "";
            }
            else {
              pcVar4 = (pbStack_160->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_178,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                       ,0xa1,pcVar4);
            testing::internal::AssertHelper::operator=(&local_178,(Message *)&local_128);
            testing::internal::AssertHelper::~AssertHelper(&local_178);
            if (local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start != (float *)0x0) {
              (**(code **)(*(long *)local_128.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start + 8))();
            }
          }
          if (pbStack_160 !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&pbStack_160,pbStack_160);
          }
          testing::internal::CmpHelperEQ<float,float>
                    ((internal *)local_168,"d[2]","d_out[2]",
                     local_110.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start + 2,pfVar1 + 2);
          if (local_168[0]._0_1_ == (internal)0x0) {
            testing::Message::Message((Message *)&local_128);
            if (pbStack_160 ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar4 = "";
            }
            else {
              pcVar4 = (pbStack_160->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_178,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                       ,0xa2,pcVar4);
            testing::internal::AssertHelper::operator=(&local_178,(Message *)&local_128);
            testing::internal::AssertHelper::~AssertHelper(&local_178);
            if (local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start != (float *)0x0) {
              (**(code **)(*(long *)local_128.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start + 8))();
            }
          }
          if (pbStack_160 !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&pbStack_160,pbStack_160);
          }
          testing::internal::CmpHelperEQ<float,float>
                    ((internal *)local_168,"d[3]","d_out[3]",
                     local_110.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start + 3,pfVar1 + 3);
          if (local_168[0]._0_1_ == (internal)0x0) {
            testing::Message::Message((Message *)&local_128);
            if (pbStack_160 ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar4 = "";
            }
            else {
              pcVar4 = (pbStack_160->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_178,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                       ,0xa3,pcVar4);
            testing::internal::AssertHelper::operator=(&local_178,(Message *)&local_128);
            testing::internal::AssertHelper::~AssertHelper(&local_178);
            if (local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start != (float *)0x0) {
              (**(code **)(*(long *)local_128.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start + 8))();
            }
          }
          if (pbStack_160 !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&pbStack_160,pbStack_160);
          }
          testing::internal::CmpHelperEQ<float,float>
                    ((internal *)local_168,"d[4]","d_out[4]",
                     local_110.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start + 4,pfVar1 + 4);
          if (local_168[0]._0_1_ == (internal)0x0) {
            testing::Message::Message((Message *)&local_128);
            if (pbStack_160 ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar4 = "";
            }
            else {
              pcVar4 = (pbStack_160->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_178,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                       ,0xa4,pcVar4);
            testing::internal::AssertHelper::operator=(&local_178,(Message *)&local_128);
            testing::internal::AssertHelper::~AssertHelper(&local_178);
            if (local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start != (float *)0x0) {
              (**(code **)(*(long *)local_128.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start + 8))();
            }
          }
          if (pbStack_160 !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&pbStack_160,pbStack_160);
          }
          testing::internal::CmpHelperEQ<float,float>
                    ((internal *)local_168,"d[5]","d_out[5]",
                     local_110.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start + 5,pfVar1 + 5);
          if (local_168[0]._0_1_ == (internal)0x0) {
            testing::Message::Message((Message *)&local_128);
            if (pbStack_160 ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar4 = "";
            }
            else {
              pcVar4 = (pbStack_160->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_178,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                       ,0xa5,pcVar4);
            testing::internal::AssertHelper::operator=(&local_178,(Message *)&local_128);
            testing::internal::AssertHelper::~AssertHelper(&local_178);
            if (local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start != (float *)0x0) {
              (**(code **)(*(long *)local_128.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start + 8))();
            }
          }
          if (pbStack_160 !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&pbStack_160,pbStack_160);
          }
          testing::internal::CmpHelperEQ<float,float>
                    ((internal *)local_168,"d[6]","d_out[6]",
                     local_110.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start + 6,local_b0);
          if (local_168[0]._0_1_ == (internal)0x0) {
            testing::Message::Message((Message *)&local_128);
            if (pbStack_160 ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar4 = "";
            }
            else {
              pcVar4 = (pbStack_160->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_178,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                       ,0xa6,pcVar4);
            testing::internal::AssertHelper::operator=(&local_178,(Message *)&local_128);
            testing::internal::AssertHelper::~AssertHelper(&local_178);
            if (local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start != (float *)0x0) {
              (**(code **)(*(long *)local_128.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start + 8))();
            }
          }
          if (pbStack_160 !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&pbStack_160,pbStack_160);
          }
          testing::internal::CmpHelperEQ<float,float>
                    ((internal *)local_168,"d[7]","d_out[7]",
                     local_110.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start + 7,local_a8);
          if (local_168[0]._0_1_ == (internal)0x0) {
            testing::Message::Message((Message *)&local_128);
            if (pbStack_160 ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar4 = "";
            }
            else {
              pcVar4 = (pbStack_160->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_178,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                       ,0xa7,pcVar4);
            testing::internal::AssertHelper::operator=(&local_178,(Message *)&local_128);
            testing::internal::AssertHelper::~AssertHelper(&local_178);
            if (local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start != (float *)0x0) {
              (**(code **)(*(long *)local_128.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start + 8))();
            }
          }
          if (pbStack_160 !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&pbStack_160,pbStack_160);
          }
          local_138 = 0x4160000041500000;
          uStack_130 = 0x4180000041700000;
          local_148 = 0x4120000041100000;
          uStack_140 = 0x4140000041300000;
          local_158 = 0x40c0000040a00000;
          uStack_150 = 0x4100000040e00000;
          local_168[0] = 1.0;
          local_168[1] = 2.0;
          pbStack_160 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x4080000040400000;
          __l_03._M_len = 0x10;
          __l_03._M_array = local_168;
          std::vector<float,_std::allocator<float>_>::vector
                    (&local_128,__l_03,(allocator_type *)&local_178);
          pfVar1 = (float *)operator_new(0x40);
          pfVar1[0xc] = 0.0;
          pfVar1[0xd] = 0.0;
          pfVar1[0xe] = 0.0;
          pfVar1[0xf] = 0.0;
          pfVar1[8] = 0.0;
          pfVar1[9] = 0.0;
          pfVar1[10] = 0.0;
          pfVar1[0xb] = 0.0;
          pfVar1[4] = 0.0;
          pfVar1[5] = 0.0;
          pfVar1[6] = 0.0;
          pfVar1[7] = 0.0;
          pfVar1[0] = 0.0;
          pfVar1[1] = 0.0;
          pfVar1[2] = 0.0;
          pfVar1[3] = 0.0;
          if ((long)local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start == 0x40) {
            if (local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start) {
              uVar3 = 0;
              do {
                pfVar1[uVar3] =
                     local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar3 >> 1 ^ uVar3];
                uVar3 = uVar3 + 1;
              } while (uVar3 != 0x10);
            }
            testing::internal::CmpHelperEQ<float,float>
                      ((internal *)local_168,"e[ 0]","e_out[ 0]",
                       local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start,pfVar1);
            if (local_168[0]._0_1_ == (internal)0x0) {
              testing::Message::Message((Message *)&local_178);
              if (pbStack_160 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar4 = "";
              }
              else {
                pcVar4 = (pbStack_160->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_170,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                         ,0xb1,pcVar4);
              testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_178);
              testing::internal::AssertHelper::~AssertHelper(&local_170);
              if (local_178.data_ != (AssertHelperData *)0x0) {
                (**(code **)(*(long *)local_178.data_ + 8))();
              }
            }
            pfVar2 = pfVar1 + 1;
            if (pbStack_160 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&pbStack_160,pbStack_160);
            }
            testing::internal::CmpHelperEQ<float,float>
                      ((internal *)local_168,"e[ 1]","e_out[ 1]",
                       local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start + 1,pfVar2);
            if (local_168[0]._0_1_ == (internal)0x0) {
              testing::Message::Message((Message *)&local_178);
              if (pbStack_160 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar4 = "";
              }
              else {
                pcVar4 = (pbStack_160->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_170,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                         ,0xb2,pcVar4);
              testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_178);
              testing::internal::AssertHelper::~AssertHelper(&local_170);
              if (local_178.data_ != (AssertHelperData *)0x0) {
                (**(code **)(*(long *)local_178.data_ + 8))();
              }
            }
            if (pbStack_160 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&pbStack_160,pbStack_160);
            }
            testing::internal::CmpHelperEQ<float,float>
                      ((internal *)local_168,"e[ 2]","e_out[ 3]",
                       local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start + 2,pfVar1 + 3);
            if (local_168[0]._0_1_ == (internal)0x0) {
              testing::Message::Message((Message *)&local_178);
              if (pbStack_160 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar4 = "";
              }
              else {
                pcVar4 = (pbStack_160->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_170,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                         ,0xb3,pcVar4);
              testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_178);
              testing::internal::AssertHelper::~AssertHelper(&local_170);
              if (local_178.data_ != (AssertHelperData *)0x0) {
                (**(code **)(*(long *)local_178.data_ + 8))();
              }
            }
            if (pbStack_160 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&pbStack_160,pbStack_160);
            }
            local_b0 = pfVar1 + 2;
            testing::internal::CmpHelperEQ<float,float>
                      ((internal *)local_168,"e[ 3]","e_out[ 2]",
                       local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start + 3,local_b0);
            if (local_168[0]._0_1_ == (internal)0x0) {
              testing::Message::Message((Message *)&local_178);
              if (pbStack_160 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar4 = "";
              }
              else {
                pcVar4 = (pbStack_160->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_170,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                         ,0xb4,pcVar4);
              testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_178);
              testing::internal::AssertHelper::~AssertHelper(&local_170);
              if (local_178.data_ != (AssertHelperData *)0x0) {
                (**(code **)(*(long *)local_178.data_ + 8))();
              }
            }
            local_a8 = pfVar2;
            if (pbStack_160 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&pbStack_160,pbStack_160);
            }
            pfVar2 = pfVar1 + 7;
            testing::internal::CmpHelperEQ<float,float>
                      ((internal *)local_168,"e[ 4]","e_out[ 7]",
                       local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start + 4,pfVar2);
            if (local_168[0]._0_1_ == (internal)0x0) {
              testing::Message::Message((Message *)&local_178);
              if (pbStack_160 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar4 = "";
              }
              else {
                pcVar4 = (pbStack_160->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_170,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                         ,0xb5,pcVar4);
              testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_178);
              testing::internal::AssertHelper::~AssertHelper(&local_170);
              if (local_178.data_ != (AssertHelperData *)0x0) {
                (**(code **)(*(long *)local_178.data_ + 8))();
              }
            }
            if (pbStack_160 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&pbStack_160,pbStack_160);
            }
            local_40 = pfVar1 + 6;
            testing::internal::CmpHelperEQ<float,float>
                      ((internal *)local_168,"e[ 5]","e_out[ 6]",
                       local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start + 5,local_40);
            if (local_168[0]._0_1_ == (internal)0x0) {
              testing::Message::Message((Message *)&local_178);
              if (pbStack_160 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar4 = "";
              }
              else {
                pcVar4 = (pbStack_160->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_170,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                         ,0xb6,pcVar4);
              testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_178);
              testing::internal::AssertHelper::~AssertHelper(&local_170);
              if (local_178.data_ != (AssertHelperData *)0x0) {
                (**(code **)(*(long *)local_178.data_ + 8))();
              }
            }
            if (pbStack_160 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&pbStack_160,pbStack_160);
            }
            local_38 = pfVar1 + 4;
            testing::internal::CmpHelperEQ<float,float>
                      ((internal *)local_168,"e[ 6]","e_out[ 4]",
                       local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start + 6,local_38);
            if (local_168[0]._0_1_ == (internal)0x0) {
              testing::Message::Message((Message *)&local_178);
              if (pbStack_160 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar4 = "";
              }
              else {
                pcVar4 = (pbStack_160->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_170,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                         ,0xb7,pcVar4);
              testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_178);
              testing::internal::AssertHelper::~AssertHelper(&local_170);
              if (local_178.data_ != (AssertHelperData *)0x0) {
                (**(code **)(*(long *)local_178.data_ + 8))();
              }
            }
            if (pbStack_160 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&pbStack_160,pbStack_160);
            }
            local_48 = pfVar1 + 5;
            testing::internal::CmpHelperEQ<float,float>
                      ((internal *)local_168,"e[ 7]","e_out[ 5]",
                       local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start + 7,local_48);
            if (local_168[0]._0_1_ == (internal)0x0) {
              testing::Message::Message((Message *)&local_178);
              if (pbStack_160 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar4 = "";
              }
              else {
                pcVar4 = (pbStack_160->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_170,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                         ,0xb8,pcVar4);
              testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_178);
              testing::internal::AssertHelper::~AssertHelper(&local_170);
              if (local_178.data_ != (AssertHelperData *)0x0) {
                (**(code **)(*(long *)local_178.data_ + 8))();
              }
            }
            if (pbStack_160 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&pbStack_160,pbStack_160);
            }
            local_68 = pfVar1 + 0xf;
            testing::internal::CmpHelperEQ<float,float>
                      ((internal *)local_168,"e[ 8]","e_out[15]",
                       local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start + 8,local_68);
            if (local_168[0]._0_1_ == (internal)0x0) {
              testing::Message::Message((Message *)&local_178);
              if (pbStack_160 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar4 = "";
              }
              else {
                pcVar4 = (pbStack_160->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_170,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                         ,0xb9,pcVar4);
              testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_178);
              testing::internal::AssertHelper::~AssertHelper(&local_170);
              if (local_178.data_ != (AssertHelperData *)0x0) {
                (**(code **)(*(long *)local_178.data_ + 8))();
              }
            }
            if (pbStack_160 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&pbStack_160,pbStack_160);
            }
            local_70 = pfVar1 + 0xe;
            testing::internal::CmpHelperEQ<float,float>
                      ((internal *)local_168,"e[ 9]","e_out[14]",
                       local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start + 9,local_70);
            if (local_168[0]._0_1_ == (internal)0x0) {
              testing::Message::Message((Message *)&local_178);
              if (pbStack_160 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar4 = "";
              }
              else {
                pcVar4 = (pbStack_160->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_170,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                         ,0xba,pcVar4);
              testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_178);
              testing::internal::AssertHelper::~AssertHelper(&local_170);
              if (local_178.data_ != (AssertHelperData *)0x0) {
                (**(code **)(*(long *)local_178.data_ + 8))();
              }
            }
            if (pbStack_160 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&pbStack_160,pbStack_160);
            }
            local_60 = pfVar1 + 0xc;
            testing::internal::CmpHelperEQ<float,float>
                      ((internal *)local_168,"e[10]","e_out[12]",
                       local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start + 10,local_60);
            if (local_168[0]._0_1_ == (internal)0x0) {
              testing::Message::Message((Message *)&local_178);
              if (pbStack_160 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar4 = "";
              }
              else {
                pcVar4 = (pbStack_160->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_170,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                         ,0xbb,pcVar4);
              testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_178);
              testing::internal::AssertHelper::~AssertHelper(&local_170);
              if (local_178.data_ != (AssertHelperData *)0x0) {
                (**(code **)(*(long *)local_178.data_ + 8))();
              }
            }
            if (pbStack_160 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&pbStack_160,pbStack_160);
            }
            local_78 = pfVar1 + 0xd;
            testing::internal::CmpHelperEQ<float,float>
                      ((internal *)local_168,"e[11]","e_out[13]",
                       local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start + 0xb,local_78);
            if (local_168[0]._0_1_ == (internal)0x0) {
              testing::Message::Message((Message *)&local_178);
              if (pbStack_160 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar4 = "";
              }
              else {
                pcVar4 = (pbStack_160->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_170,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                         ,0xbc,pcVar4);
              testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_178);
              testing::internal::AssertHelper::~AssertHelper(&local_170);
              if (local_178.data_ != (AssertHelperData *)0x0) {
                (**(code **)(*(long *)local_178.data_ + 8))();
              }
            }
            if (pbStack_160 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&pbStack_160,pbStack_160);
            }
            local_58 = pfVar1 + 8;
            testing::internal::CmpHelperEQ<float,float>
                      ((internal *)local_168,"e[12]","e_out[ 8]",
                       local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start + 0xc,local_58);
            if (local_168[0]._0_1_ == (internal)0x0) {
              testing::Message::Message((Message *)&local_178);
              if (pbStack_160 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar4 = "";
              }
              else {
                pcVar4 = (pbStack_160->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_170,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                         ,0xbd,pcVar4);
              testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_178);
              testing::internal::AssertHelper::~AssertHelper(&local_170);
              if (local_178.data_ != (AssertHelperData *)0x0) {
                (**(code **)(*(long *)local_178.data_ + 8))();
              }
            }
            local_50 = pfVar2;
            if (pbStack_160 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&pbStack_160,pbStack_160);
            }
            testing::internal::CmpHelperEQ<float,float>
                      ((internal *)local_168,"e[13]","e_out[ 9]",
                       local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start + 0xd,pfVar1 + 9);
            if (local_168[0]._0_1_ == (internal)0x0) {
              testing::Message::Message((Message *)&local_178);
              if (pbStack_160 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar4 = "";
              }
              else {
                pcVar4 = (pbStack_160->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_170,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                         ,0xbe,pcVar4);
              testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_178);
              testing::internal::AssertHelper::~AssertHelper(&local_170);
              if (local_178.data_ != (AssertHelperData *)0x0) {
                (**(code **)(*(long *)local_178.data_ + 8))();
              }
            }
            if (pbStack_160 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&pbStack_160,pbStack_160);
            }
            local_80 = pfVar1 + 0xb;
            testing::internal::CmpHelperEQ<float,float>
                      ((internal *)local_168,"e[14]","e_out[11]",
                       local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start + 0xe,local_80);
            if (local_168[0]._0_1_ == (internal)0x0) {
              testing::Message::Message((Message *)&local_178);
              if (pbStack_160 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar4 = "";
              }
              else {
                pcVar4 = (pbStack_160->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_170,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                         ,0xbf,pcVar4);
              testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_178);
              testing::internal::AssertHelper::~AssertHelper(&local_170);
              if (local_178.data_ != (AssertHelperData *)0x0) {
                (**(code **)(*(long *)local_178.data_ + 8))();
              }
            }
            if (pbStack_160 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&pbStack_160,pbStack_160);
            }
            testing::internal::CmpHelperEQ<float,float>
                      ((internal *)local_168,"e[15]","e_out[10]",
                       local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start + 0xf,pfVar1 + 10);
            if (local_168[0]._0_1_ == (internal)0x0) {
              testing::Message::Message((Message *)&local_178);
              if (pbStack_160 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar4 = "";
              }
              else {
                pcVar4 = (pbStack_160->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_170,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                         ,0xc0,pcVar4);
              testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_178);
              testing::internal::AssertHelper::~AssertHelper(&local_170);
              if (local_178.data_ != (AssertHelperData *)0x0) {
                (**(code **)(*(long *)local_178.data_ + 8))();
              }
            }
            if (pbStack_160 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&pbStack_160,pbStack_160);
            }
            qpixl::frqi::grayPermutation<std::vector<float,std::allocator<float>>>(&local_128);
            testing::internal::CmpHelperEQ<float,float>
                      ((internal *)local_168,"e[ 0]","e_out[ 0]",
                       local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start,pfVar1);
            pfVar2 = local_a8;
            if (local_168[0]._0_1_ == (internal)0x0) {
              testing::Message::Message((Message *)&local_178);
              if (pbStack_160 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar4 = "";
              }
              else {
                pcVar4 = (pbStack_160->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_170,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                         ,0xc3,pcVar4);
              testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_178);
              testing::internal::AssertHelper::~AssertHelper(&local_170);
              if (local_178.data_ != (AssertHelperData *)0x0) {
                (**(code **)(*(long *)local_178.data_ + 8))();
              }
            }
            if (pbStack_160 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&pbStack_160,pbStack_160);
            }
            testing::internal::CmpHelperEQ<float,float>
                      ((internal *)local_168,"e[ 1]","e_out[ 1]",
                       local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start + 1,pfVar2);
            if (local_168[0]._0_1_ == (internal)0x0) {
              testing::Message::Message((Message *)&local_178);
              if (pbStack_160 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar4 = "";
              }
              else {
                pcVar4 = (pbStack_160->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_170,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                         ,0xc4,pcVar4);
              testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_178);
              testing::internal::AssertHelper::~AssertHelper(&local_170);
              if (local_178.data_ != (AssertHelperData *)0x0) {
                (**(code **)(*(long *)local_178.data_ + 8))();
              }
            }
            if (pbStack_160 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&pbStack_160,pbStack_160);
            }
            testing::internal::CmpHelperEQ<float,float>
                      ((internal *)local_168,"e[ 2]","e_out[ 2]",
                       local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start + 2,local_b0);
            if (local_168[0]._0_1_ == (internal)0x0) {
              testing::Message::Message((Message *)&local_178);
              if (pbStack_160 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar4 = "";
              }
              else {
                pcVar4 = (pbStack_160->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_170,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                         ,0xc5,pcVar4);
              testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_178);
              testing::internal::AssertHelper::~AssertHelper(&local_170);
              if (local_178.data_ != (AssertHelperData *)0x0) {
                (**(code **)(*(long *)local_178.data_ + 8))();
              }
            }
            if (pbStack_160 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&pbStack_160,pbStack_160);
            }
            testing::internal::CmpHelperEQ<float,float>
                      ((internal *)local_168,"e[ 3]","e_out[ 3]",
                       local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start + 3,pfVar1 + 3);
            if (local_168[0]._0_1_ == (internal)0x0) {
              testing::Message::Message((Message *)&local_178);
              if (pbStack_160 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar4 = "";
              }
              else {
                pcVar4 = (pbStack_160->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_170,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                         ,0xc6,pcVar4);
              testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_178);
              testing::internal::AssertHelper::~AssertHelper(&local_170);
              if (local_178.data_ != (AssertHelperData *)0x0) {
                (**(code **)(*(long *)local_178.data_ + 8))();
              }
            }
            if (pbStack_160 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&pbStack_160,pbStack_160);
            }
            testing::internal::CmpHelperEQ<float,float>
                      ((internal *)local_168,"e[ 4]","e_out[ 4]",
                       local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start + 4,local_38);
            if (local_168[0]._0_1_ == (internal)0x0) {
              testing::Message::Message((Message *)&local_178);
              if (pbStack_160 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar4 = "";
              }
              else {
                pcVar4 = (pbStack_160->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_170,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                         ,199,pcVar4);
              testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_178);
              testing::internal::AssertHelper::~AssertHelper(&local_170);
              if (local_178.data_ != (AssertHelperData *)0x0) {
                (**(code **)(*(long *)local_178.data_ + 8))();
              }
            }
            if (pbStack_160 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&pbStack_160,pbStack_160);
            }
            testing::internal::CmpHelperEQ<float,float>
                      ((internal *)local_168,"e[ 5]","e_out[ 5]",
                       local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start + 5,local_48);
            if (local_168[0]._0_1_ == (internal)0x0) {
              testing::Message::Message((Message *)&local_178);
              if (pbStack_160 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar4 = "";
              }
              else {
                pcVar4 = (pbStack_160->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_170,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                         ,200,pcVar4);
              testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_178);
              testing::internal::AssertHelper::~AssertHelper(&local_170);
              if (local_178.data_ != (AssertHelperData *)0x0) {
                (**(code **)(*(long *)local_178.data_ + 8))();
              }
            }
            if (pbStack_160 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&pbStack_160,pbStack_160);
            }
            testing::internal::CmpHelperEQ<float,float>
                      ((internal *)local_168,"e[ 6]","e_out[ 6]",
                       local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start + 6,local_40);
            if (local_168[0]._0_1_ == (internal)0x0) {
              testing::Message::Message((Message *)&local_178);
              if (pbStack_160 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar4 = "";
              }
              else {
                pcVar4 = (pbStack_160->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_170,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                         ,0xc9,pcVar4);
              testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_178);
              testing::internal::AssertHelper::~AssertHelper(&local_170);
              if (local_178.data_ != (AssertHelperData *)0x0) {
                (**(code **)(*(long *)local_178.data_ + 8))();
              }
            }
            if (pbStack_160 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&pbStack_160,pbStack_160);
            }
            testing::internal::CmpHelperEQ<float,float>
                      ((internal *)local_168,"e[ 7]","e_out[ 7]",
                       local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start + 7,local_50);
            if (local_168[0]._0_1_ == (internal)0x0) {
              testing::Message::Message((Message *)&local_178);
              if (pbStack_160 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar4 = "";
              }
              else {
                pcVar4 = (pbStack_160->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_170,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                         ,0xca,pcVar4);
              testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_178);
              testing::internal::AssertHelper::~AssertHelper(&local_170);
              if (local_178.data_ != (AssertHelperData *)0x0) {
                (**(code **)(*(long *)local_178.data_ + 8))();
              }
            }
            if (pbStack_160 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&pbStack_160,pbStack_160);
            }
            testing::internal::CmpHelperEQ<float,float>
                      ((internal *)local_168,"e[ 8]","e_out[ 8]",
                       local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start + 8,local_58);
            if (local_168[0]._0_1_ == (internal)0x0) {
              testing::Message::Message((Message *)&local_178);
              if (pbStack_160 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar4 = "";
              }
              else {
                pcVar4 = (pbStack_160->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_170,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                         ,0xcb,pcVar4);
              testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_178);
              testing::internal::AssertHelper::~AssertHelper(&local_170);
              if (local_178.data_ != (AssertHelperData *)0x0) {
                (**(code **)(*(long *)local_178.data_ + 8))();
              }
            }
            if (pbStack_160 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&pbStack_160,pbStack_160);
            }
            testing::internal::CmpHelperEQ<float,float>
                      ((internal *)local_168,"e[ 9]","e_out[ 9]",
                       local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start + 9,pfVar1 + 9);
            if (local_168[0]._0_1_ == (internal)0x0) {
              testing::Message::Message((Message *)&local_178);
              if (pbStack_160 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar4 = "";
              }
              else {
                pcVar4 = (pbStack_160->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_170,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                         ,0xcc,pcVar4);
              testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_178);
              testing::internal::AssertHelper::~AssertHelper(&local_170);
              if (local_178.data_ != (AssertHelperData *)0x0) {
                (**(code **)(*(long *)local_178.data_ + 8))();
              }
            }
            if (pbStack_160 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&pbStack_160,pbStack_160);
            }
            testing::internal::CmpHelperEQ<float,float>
                      ((internal *)local_168,"e[10]","e_out[10]",
                       local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start + 10,pfVar1 + 10);
            if (local_168[0]._0_1_ == (internal)0x0) {
              testing::Message::Message((Message *)&local_178);
              if (pbStack_160 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar4 = "";
              }
              else {
                pcVar4 = (pbStack_160->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_170,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                         ,0xcd,pcVar4);
              testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_178);
              testing::internal::AssertHelper::~AssertHelper(&local_170);
              if (local_178.data_ != (AssertHelperData *)0x0) {
                (**(code **)(*(long *)local_178.data_ + 8))();
              }
            }
            if (pbStack_160 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&pbStack_160,pbStack_160);
            }
            testing::internal::CmpHelperEQ<float,float>
                      ((internal *)local_168,"e[11]","e_out[11]",
                       local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start + 0xb,local_80);
            if (local_168[0]._0_1_ == (internal)0x0) {
              testing::Message::Message((Message *)&local_178);
              if (pbStack_160 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar4 = "";
              }
              else {
                pcVar4 = (pbStack_160->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_170,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                         ,0xce,pcVar4);
              testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_178);
              testing::internal::AssertHelper::~AssertHelper(&local_170);
              if (local_178.data_ != (AssertHelperData *)0x0) {
                (**(code **)(*(long *)local_178.data_ + 8))();
              }
            }
            if (pbStack_160 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&pbStack_160,pbStack_160);
            }
            testing::internal::CmpHelperEQ<float,float>
                      ((internal *)local_168,"e[12]","e_out[12]",
                       local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start + 0xc,local_60);
            if (local_168[0]._0_1_ == (internal)0x0) {
              testing::Message::Message((Message *)&local_178);
              if (pbStack_160 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar4 = "";
              }
              else {
                pcVar4 = (pbStack_160->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_170,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                         ,0xcf,pcVar4);
              testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_178);
              testing::internal::AssertHelper::~AssertHelper(&local_170);
              if (local_178.data_ != (AssertHelperData *)0x0) {
                (**(code **)(*(long *)local_178.data_ + 8))();
              }
            }
            if (pbStack_160 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&pbStack_160,pbStack_160);
            }
            testing::internal::CmpHelperEQ<float,float>
                      ((internal *)local_168,"e[13]","e_out[13]",
                       local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start + 0xd,local_78);
            if (local_168[0]._0_1_ == (internal)0x0) {
              testing::Message::Message((Message *)&local_178);
              if (pbStack_160 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar4 = "";
              }
              else {
                pcVar4 = (pbStack_160->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_170,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                         ,0xd0,pcVar4);
              testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_178);
              testing::internal::AssertHelper::~AssertHelper(&local_170);
              if (local_178.data_ != (AssertHelperData *)0x0) {
                (**(code **)(*(long *)local_178.data_ + 8))();
              }
            }
            if (pbStack_160 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&pbStack_160,pbStack_160);
            }
            testing::internal::CmpHelperEQ<float,float>
                      ((internal *)local_168,"e[14]","e_out[14]",
                       local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start + 0xe,local_70);
            if (local_168[0]._0_1_ == (internal)0x0) {
              testing::Message::Message((Message *)&local_178);
              if (pbStack_160 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar4 = "";
              }
              else {
                pcVar4 = (pbStack_160->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_170,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                         ,0xd1,pcVar4);
              testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_178);
              testing::internal::AssertHelper::~AssertHelper(&local_170);
              if (local_178.data_ != (AssertHelperData *)0x0) {
                (**(code **)(*(long *)local_178.data_ + 8))();
              }
            }
            if (pbStack_160 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&pbStack_160,pbStack_160);
            }
            testing::internal::CmpHelperEQ<float,float>
                      ((internal *)local_168,"e[15]","e_out[15]",
                       local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start + 0xf,local_68);
            if (local_168[0]._0_1_ == (internal)0x0) {
              testing::Message::Message((Message *)&local_178);
              if (pbStack_160 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar4 = "";
              }
              else {
                pcVar4 = (pbStack_160->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_170,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
                         ,0xd2,pcVar4);
              testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_178);
              testing::internal::AssertHelper::~AssertHelper(&local_170);
              if (local_178.data_ != (AssertHelperData *)0x0) {
                (**(code **)(*(long *)local_178.data_ + 8))();
              }
            }
            if (pbStack_160 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&pbStack_160,pbStack_160);
            }
            operator_delete(pfVar1,0x40);
            if (local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start != (float *)0x0) {
              operator_delete(local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_128.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_128.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            operator_delete(local_a0,0x20);
            if (local_110.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start != (float *)0x0) {
              operator_delete(local_110.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_110.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_110.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            operator_delete(local_f0,0x10);
            pfVar1 = local_d0;
            if (local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start != (float *)0x0) {
              operator_delete(local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_e8.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_e8.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            operator_delete(local_f8,8);
            if (local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start != (float *)0x0) {
              operator_delete(local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_c8.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_c8.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            operator_delete(pfVar1,4);
            if (local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start != (float *)0x0) {
              operator_delete(local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_98.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_98.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            return;
          }
        }
      }
    }
  }
  __assert_fail("n == b.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/include/qpixl/frqi/util.hpp"
                ,0x52,"void qpixl::frqi::grayPermutation(const V &, V &) [V = std::vector<float>]");
}

Assistant:

void test_qpixl_frqi_util_gray_permutation() {
  std::vector< R > a = { 1 } ;
  std::vector< R > a_out( 1 ) ;

  {
    // with copy
    qpixl::frqi::grayPermutation( a, a_out );
    EXPECT_EQ( a[0] , a_out[0] );
    // in-place
    qpixl::frqi::grayPermutation( a );
    EXPECT_EQ( a[0] , a_out[0] );
  }
  
  std::vector< R > b = { 1 , 2 };
  std::vector< R > b_out( 2 ) ;

  {
    // with copy
    qpixl::frqi::grayPermutation( b, b_out );
    EXPECT_EQ( b[0] , b_out[0] );
    EXPECT_EQ( b[1] , b_out[1] );
    // in-place
    qpixl::frqi::grayPermutation( b );
    EXPECT_EQ( b[0] , b_out[0] );
    EXPECT_EQ( b[1] , b_out[1] );
  } 

  std::vector< R > c = { 1 , 2 , 3 , 4 };
  std::vector< R > c_out( 4 ) ;

  {
    // with copy
    qpixl::frqi::grayPermutation( c, c_out );
    EXPECT_EQ( c[0] , c_out[0] );
    EXPECT_EQ( c[1] , c_out[1] );
    EXPECT_EQ( c[2] , c_out[3] );
    EXPECT_EQ( c[3] , c_out[2] );
    // in-place
    qpixl::frqi::grayPermutation( c );
    EXPECT_EQ( c[0] , c_out[0] );
    EXPECT_EQ( c[1] , c_out[1] );
    EXPECT_EQ( c[2] , c_out[2] );
    EXPECT_EQ( c[3] , c_out[3] );
  } 

  std::vector< R > d = { 1 , 2 , 3 , 4 , 5 , 6 , 7 , 8 };
  std::vector< R > d_out( 8 ) ;

  {
    // with copy
    qpixl::frqi::grayPermutation( d, d_out );
    EXPECT_EQ( d[0] , d_out[0] );
    EXPECT_EQ( d[1] , d_out[1] );
    EXPECT_EQ( d[2] , d_out[3] );
    EXPECT_EQ( d[3] , d_out[2] );
    EXPECT_EQ( d[4] , d_out[7] );
    EXPECT_EQ( d[5] , d_out[6] );
    EXPECT_EQ( d[6] , d_out[4] );
    EXPECT_EQ( d[7] , d_out[5] );
    // in-place
    qpixl::frqi::grayPermutation( d );
    EXPECT_EQ( d[0] , d_out[0] );
    EXPECT_EQ( d[1] , d_out[1] );
    EXPECT_EQ( d[2] , d_out[2] );
    EXPECT_EQ( d[3] , d_out[3] );
    EXPECT_EQ( d[4] , d_out[4] );
    EXPECT_EQ( d[5] , d_out[5] );
    EXPECT_EQ( d[6] , d_out[6] );
    EXPECT_EQ( d[7] , d_out[7] );
  }

  std::vector< R > e = { 1 , 2 , 3 , 4 , 5 , 6 , 7 , 8 , 9 , 
                         10 , 11 , 12 , 13 , 14 , 15 , 16 };
  std::vector< R > e_out( 16 ) ;

  {
    // with copy
    qpixl::frqi::grayPermutation( e, e_out );
    EXPECT_EQ( e[ 0] , e_out[ 0] );
    EXPECT_EQ( e[ 1] , e_out[ 1] );
    EXPECT_EQ( e[ 2] , e_out[ 3] );
    EXPECT_EQ( e[ 3] , e_out[ 2] );
    EXPECT_EQ( e[ 4] , e_out[ 7] );
    EXPECT_EQ( e[ 5] , e_out[ 6] );
    EXPECT_EQ( e[ 6] , e_out[ 4] );
    EXPECT_EQ( e[ 7] , e_out[ 5] );
    EXPECT_EQ( e[ 8] , e_out[15] );
    EXPECT_EQ( e[ 9] , e_out[14] );
    EXPECT_EQ( e[10] , e_out[12] );
    EXPECT_EQ( e[11] , e_out[13] );
    EXPECT_EQ( e[12] , e_out[ 8] );
    EXPECT_EQ( e[13] , e_out[ 9] );
    EXPECT_EQ( e[14] , e_out[11] );
    EXPECT_EQ( e[15] , e_out[10] );
    // in-place
    qpixl::frqi::grayPermutation( e );
    EXPECT_EQ( e[ 0] , e_out[ 0] );
    EXPECT_EQ( e[ 1] , e_out[ 1] );
    EXPECT_EQ( e[ 2] , e_out[ 2] );
    EXPECT_EQ( e[ 3] , e_out[ 3] );
    EXPECT_EQ( e[ 4] , e_out[ 4] );
    EXPECT_EQ( e[ 5] , e_out[ 5] );
    EXPECT_EQ( e[ 6] , e_out[ 6] );
    EXPECT_EQ( e[ 7] , e_out[ 7] );
    EXPECT_EQ( e[ 8] , e_out[ 8] );
    EXPECT_EQ( e[ 9] , e_out[ 9] );
    EXPECT_EQ( e[10] , e_out[10] );
    EXPECT_EQ( e[11] , e_out[11] );
    EXPECT_EQ( e[12] , e_out[12] );
    EXPECT_EQ( e[13] , e_out[13] );
    EXPECT_EQ( e[14] , e_out[14] );
    EXPECT_EQ( e[15] , e_out[15] );
  }
  
}